

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall QCborStreamReader::addData(QCborStreamReader *this,char *data,qsizetype len)

{
  long lVar1;
  pointer pQVar2;
  QCborStreamReader *in_RDX;
  char *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QMessageLogger *this_00;
  qsizetype in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  QByteArray *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
           ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                         *)0x8d6107);
  if (pQVar2->device == (QIODevice *)0x0) {
    if (0 < (long)in_RDX) {
      std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
      operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                  *)0x8d6122);
      QByteArray::append(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffd8);
    }
    reparse(in_RDX);
  }
  else {
    QMessageLogger::QMessageLogger(this_00,in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)in_RDI);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffd8,
               "QCborStreamReader: addData() with device()");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamReader::addData(const char *data, qsizetype len)
{
    if (!d->device) {
        if (len > 0)
            d->buffer.append(data, len);
        reparse();
    } else {
        qWarning("QCborStreamReader: addData() with device()");
    }
}